

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O3

void __thiscall Rml::ElementHandleTargetData::SetDefiniteMargins(ElementHandleTargetData *this)

{
  Element *pEVar1;
  Box *pBVar2;
  ulong uVar3;
  float fVar4;
  Property local_68;
  
  uVar3 = *(ulong *)&this->computed->common;
  if ((uVar3 & 0x600000) == 0) {
    pEVar1 = this->target;
    pBVar2 = Element::GetBox(pEVar1);
    fVar4 = Box::GetEdge(pBVar2,Margin,Top);
    fVar4 = Math::Round(fVar4);
    local_68.value.type = NONE;
    Variant::Set(&local_68.value,fVar4);
    local_68.unit = PX;
    local_68.specificity = -1;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.definition = (PropertyDefinition *)0x0;
    local_68.parser_index = -1;
    Element::SetProperty(pEVar1,MarginTop,&local_68);
    if (local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_68.value);
    uVar3 = *(ulong *)&this->computed->common;
  }
  if ((uVar3 & 0x3000000) == 0) {
    pEVar1 = this->target;
    pBVar2 = Element::GetBox(pEVar1);
    fVar4 = Box::GetEdge(pBVar2,Margin,Right);
    fVar4 = Math::Round(fVar4);
    local_68.value.type = NONE;
    Variant::Set(&local_68.value,fVar4);
    local_68.unit = PX;
    local_68.specificity = -1;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.definition = (PropertyDefinition *)0x0;
    local_68.parser_index = -1;
    Element::SetProperty(pEVar1,MarginRight,&local_68);
    if (local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_68.value);
    uVar3 = *(ulong *)&this->computed->common;
  }
  if ((uVar3 & 0xc000000) == 0) {
    pEVar1 = this->target;
    pBVar2 = Element::GetBox(pEVar1);
    fVar4 = Box::GetEdge(pBVar2,Margin,Bottom);
    fVar4 = Math::Round(fVar4);
    local_68.value.type = NONE;
    Variant::Set(&local_68.value,fVar4);
    local_68.unit = PX;
    local_68.specificity = -1;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.definition = (PropertyDefinition *)0x0;
    local_68.parser_index = -1;
    Element::SetProperty(pEVar1,MarginBottom,&local_68);
    if (local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_68.value);
    uVar3 = *(ulong *)&this->computed->common;
  }
  if ((uVar3 & 0x30000000) == 0) {
    pEVar1 = this->target;
    pBVar2 = Element::GetBox(pEVar1);
    fVar4 = Box::GetEdge(pBVar2,Margin,Left);
    fVar4 = Math::Round(fVar4);
    local_68.value.type = NONE;
    Variant::Set(&local_68.value,fVar4);
    local_68.unit = PX;
    local_68.specificity = -1;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.definition = (PropertyDefinition *)0x0;
    local_68.parser_index = -1;
    Element::SetProperty(pEVar1,MarginLeft,&local_68);
    if (local_68.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_68.value);
  }
  return;
}

Assistant:

void SetDefiniteMargins()
	{
		// Set any auto margins to their current value, since auto-margins may affect the size and position of an element.
		auto SetDefiniteMargin = [](Element* element, PropertyId margin_id, BoxEdge edge) {
			element->SetProperty(margin_id, Property(Math::Round(element->GetBox().GetEdge(BoxArea::Margin, edge)), Unit::PX));
		};
		using Style::Margin;
		if (computed.margin_top().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginTop, BoxEdge::Top);
		if (computed.margin_right().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginRight, BoxEdge::Right);
		if (computed.margin_bottom().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginBottom, BoxEdge::Bottom);
		if (computed.margin_left().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginLeft, BoxEdge::Left);
	}